

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmBlock(LlvmCompilationContext *ctx,ExprBlock *node)

{
  LLVMValueRef pLVar1;
  ExprBase *local_20;
  ExprBase *value;
  ExprBlock *node_local;
  LlvmCompilationContext *ctx_local;
  
  for (local_20 = (node->expressions).head; local_20 != (ExprBase *)0x0; local_20 = local_20->next)
  {
    CompileLlvm(ctx,local_20);
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmBlock(LlvmCompilationContext &ctx, ExprBlock *node)
{
	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	return CheckType(ctx, node, NULL);
}